

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.c
# Opt level: O2

void init_mem(void)

{
  int iVar1;
  long lVar2;
  FILE *__stream;
  FILE *__stream_00;
  char *__format;
  
  for (lVar2 = 0; lVar2 != 0x8000; lVar2 = lVar2 + 1) {
    RAM[lVar2] = '\0';
  }
  printf("Opening ROM Image files...");
  __stream = fopen("roms/os.bin","rb");
  if (__stream == (FILE *)0x0) {
    __format = "\nError: Could not open OS_ROM image.";
  }
  else {
    __stream_00 = fopen("roms/basic.bin","rb");
    if (__stream_00 == (FILE *)0x0) {
      __format = "\nError: Could not open lang_ROM image.";
    }
    else {
      puts("Done");
      lVar2 = 0;
      printf("Reading ROM Image data...");
      do {
        if (lVar2 == 0x4000) {
          puts("Done");
          printf("Closing ROM Image files...");
          fclose(__stream);
          fclose(__stream_00);
          puts("Done");
          return;
        }
        iVar1 = getc(__stream);
        OS_ROM[lVar2] = (uchar)iVar1;
        iVar1 = getc(__stream_00);
        lang_ROM[lVar2] = (uchar)iVar1;
        iVar1 = ferror(__stream_00);
        if (iVar1 != 0) break;
        iVar1 = ferror(__stream);
        lVar2 = lVar2 + 1;
      } while (iVar1 == 0);
      __format = "\nFatal Error:- Rom image file error";
    }
  }
  printf(__format);
  exit(1);
}

Assistant:

void init_mem(void)     // initialise the 6502 memory space
{
    FILE *fp1;           // misc files pointers
    FILE *fp2;
    unsigned int c;      // misc loop counter

    for (c = 0; c < 0x8000; c++) {
        RAM[c] = 0;         // intiialise the 6502 emulator RAM
    }

    printf("Opening ROM Image files..."); // display pretty startup status
    if ((fp1 = fopen("roms/os.bin", "rb")) == NULL) {
        printf("\nError: Could not open OS_ROM image.");
        exit(1);    // exit abnormally
    }
    if ((fp2 = fopen("roms/basic.bin", "rb")) == NULL) {
        printf("\nError: Could not open lang_ROM image.");
        exit(1);    // exit abnormally
    }
    printf("Done\n"); // display pretty status status


    printf("Reading ROM Image data..."); // display pretty startup status
    for (c = 0; c < 0x4000; c++)   // initialise the ROM blocks
    {
        OS_ROM[c] = (ubyte) getc(fp1);    // read data from the image files
        lang_ROM[c] = (ubyte) getc(fp2);  //

        if ((ferror(fp2)) || (ferror(fp1))) {
            printf("\nFatal Error:- Rom image file error");
            exit(1);          // exit abnormally if there is a file error
        }
    }
    printf("Done\n");    // display pretty startup status

    printf("Closing ROM Image files...");
    fclose(fp1);
    fclose(fp2);          // close the image files
    printf("Done\n");

}